

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O0

void compute_color(gdImagePtr oim,gdImagePtr nim,my_cquantize_ptr cquantize,boxptr boxp,int icolor)

{
  ulong uVar1;
  long lVar2;
  long local_90;
  long c2total;
  long c1total;
  long c0total;
  long total;
  long count;
  int c2max;
  int c2min;
  int c1max;
  int c1min;
  int c0max;
  int c0min;
  int c2;
  int c1;
  int c0;
  histptr histp;
  hist3d histogram;
  int icolor_local;
  boxptr boxp_local;
  my_cquantize_ptr cquantize_local;
  gdImagePtr nim_local;
  gdImagePtr oim_local;
  
  c0total = 0;
  c1total = 0;
  c2total = 0;
  local_90 = 0;
  for (c2 = boxp->c0min; c0min = boxp->c1min, c2 <= boxp->c0max; c2 = c2 + 1) {
    for (; c0min <= boxp->c1max; c0min = c0min + 1) {
      _c1 = cquantize->histogram[c2][c0min] + boxp->c2min;
      for (c0max = boxp->c2min; c0max <= boxp->c2max; c0max = c0max + 1) {
        uVar1 = (ulong)*_c1;
        if (uVar1 != 0) {
          c0total = uVar1 + c0total;
          c1total = (long)(c2 * 8 + 4) * uVar1 + c1total;
          c2total = (long)(c0min * 4 + 2) * uVar1 + c2total;
          local_90 = (long)(c0max * 8 + 4) * uVar1 + local_90;
        }
        _c1 = _c1 + 1;
      }
    }
  }
  if (c0total == 0) {
    nim->red[icolor] = 0xff;
    nim->green[icolor] = 0xff;
    nim->blue[icolor] = 0xff;
  }
  else {
    lVar2 = c0total >> 1;
    nim->red[icolor] = (int)((c1total + lVar2) / c0total);
    nim->green[icolor] = (int)((c2total + lVar2) / c0total);
    nim->blue[icolor] = (int)((local_90 + lVar2) / c0total);
  }
  nim->open[icolor] = 0;
  return;
}

Assistant:

LOCAL (void)
compute_color (gdImagePtr oim, gdImagePtr nim, my_cquantize_ptr cquantize,
	       boxptr boxp, int icolor)
{
	hist3d histogram = cquantize->histogram;
	histptr histp;
	int c0, c1, c2;
	int c0min, c0max, c1min, c1max, c2min, c2max;
	long count = 0; /* 2.0.28: = 0 */
	long total = 0;
	long c0total = 0;
	long c1total = 0;
	long c2total = 0;
	(void)oim;

	c0min = boxp->c0min;
	c0max = boxp->c0max;
	c1min = boxp->c1min;
	c1max = boxp->c1max;
	c2min = boxp->c2min;
	c2max = boxp->c2max;

	for (c0 = c0min; c0 <= c0max; c0++)
		for (c1 = c1min; c1 <= c1max; c1++) {
			histp = &histogram[c0][c1][c2min];
			for (c2 = c2min; c2 <= c2max; c2++) {
				if ((count = *histp++) != 0) {
					total += count;
					c0total +=
					    ((c0 << C0_SHIFT) + ((1 << C0_SHIFT) >> 1)) * count;
					c1total +=
					    ((c1 << C1_SHIFT) + ((1 << C1_SHIFT) >> 1)) * count;
					c2total +=
					    ((c2 << C2_SHIFT) + ((1 << C2_SHIFT) >> 1)) * count;
				}
			}
		}

	/* 2.0.16: Paul den Dulk found an occasion where total can be 0 */
	if (total) {
		nim->red[icolor] = (int) ((c0total + (total >> 1)) / total);
		nim->green[icolor] = (int) ((c1total + (total >> 1)) / total);
		nim->blue[icolor] = (int) ((c2total + (total >> 1)) / total);
	} else {
		nim->red[icolor] = 255;
		nim->green[icolor] = 255;
		nim->blue[icolor] = 255;
	}
	nim->open[icolor] = 0;
}